

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SeekHead::Write(SeekHead *this,IMkvWriter *writer)

{
  undefined8 uVar1;
  uint64 uVar2;
  long *in_RSI;
  uint64 in_RDI;
  uint64_t bytes_written;
  uint64_t size;
  uint64_t entry_size;
  uint64 in_stack_ffffffffffffffd0;
  SeekHead *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = in_RDI;
  MaxEntrySize(in_stack_ffffffffffffffe0);
  EbmlMasterElementSize(in_stack_ffffffffffffffd0,in_RDI);
  uVar1 = (**(code **)(*in_RSI + 8))();
  *(undefined8 *)(in_RDI + 0x40) = uVar1;
  uVar2 = WriteVoidElement((IMkvWriter *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),uVar2);
  return uVar2 != 0;
}

Assistant:

bool SeekHead::Write(IMkvWriter* writer) {
  const uint64_t entry_size = kSeekEntryCount * MaxEntrySize();
  const uint64_t size =
      EbmlMasterElementSize(libwebm::kMkvSeekHead, entry_size);

  start_pos_ = writer->Position();

  const uint64_t bytes_written = WriteVoidElement(writer, size + entry_size);
  if (!bytes_written)
    return false;

  return true;
}